

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O0

deUint32 deBitMask32(int leastSignificantBitNdx,int numBits)

{
  int numBits_local;
  int leastSignificantBitNdx_local;
  
  if ((numBits < 0x20) && (leastSignificantBitNdx < 0x20)) {
    numBits_local = (1 << ((byte)numBits & 0x1f)) + -1 << ((byte)leastSignificantBitNdx & 0x1f);
  }
  else if ((numBits == 0) && (leastSignificantBitNdx == 0x20)) {
    numBits_local = 0;
  }
  else {
    numBits_local = -1;
  }
  return numBits_local;
}

Assistant:

DE_INLINE deUint32 deBitMask32 (int leastSignificantBitNdx, int numBits)
{
	DE_ASSERT(deInRange32(leastSignificantBitNdx, 0, 32));
	DE_ASSERT(deInRange32(numBits, 0, 32));
	DE_ASSERT(deInRange32(leastSignificantBitNdx+numBits, 0, 32));

	if (numBits < 32 && leastSignificantBitNdx < 32)
		return ((1u<<numBits)-1u) << (deUint32)leastSignificantBitNdx;
	else if (numBits == 0 && leastSignificantBitNdx == 32)
		return 0u;
	else
	{
		DE_ASSERT(numBits == 32 && leastSignificantBitNdx == 0);
		return 0xFFFFFFFFu;
	}
}